

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonmax.c
# Opt level: O0

xy * aom_nonmax_suppression
               (xy *corners,int *scores,int num_corners,int **ret_scores,int *ret_num_nonmax)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  bool bVar5;
  void *__ptr;
  void *__ptr_00;
  undefined8 *in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int *in_R8;
  int x_1;
  int x;
  xy pos;
  int score;
  int prev_row;
  int point_below;
  int point_above;
  int sz;
  int *nonmax_scores;
  xy *ret_nonmax;
  int j;
  int i;
  int *row_start;
  int last_row;
  int num_nonmax;
  int local_74;
  int iStack_70;
  int local_68;
  int local_64;
  int local_60;
  int local_48;
  int local_44;
  int local_34;
  xy *local_8;
  
  local_34 = 0;
  local_60 = 0;
  local_64 = 0;
  *in_RCX = 0;
  *in_R8 = -1;
  if (((in_RDI == 0) || (in_RSI == 0)) || (in_EDX < 1)) {
    *in_R8 = 0;
    local_8 = (xy *)0x0;
  }
  else {
    local_8 = (xy *)malloc((long)in_EDX << 3);
    if (local_8 == (xy *)0x0) {
      local_8 = (xy *)0x0;
    }
    else {
      __ptr = malloc((long)in_EDX << 2);
      if (__ptr == (void *)0x0) {
        free(local_8);
        local_8 = (xy *)0x0;
      }
      else {
        iVar1 = *(int *)(in_RDI + 4 + (long)(in_EDX + -1) * 8);
        __ptr_00 = malloc((long)(iVar1 + 1) << 2);
        if (__ptr_00 == (void *)0x0) {
          free(local_8);
          free(__ptr);
          local_8 = (xy *)0x0;
        }
        else {
          for (local_44 = 0; local_44 < iVar1 + 1; local_44 = local_44 + 1) {
            *(undefined4 *)((long)__ptr_00 + (long)local_44 * 4) = 0xffffffff;
          }
          local_68 = -1;
          for (local_44 = 0; local_44 < in_EDX; local_44 = local_44 + 1) {
            if (*(int *)(in_RDI + 4 + (long)local_44 * 8) != local_68) {
              *(int *)((long)__ptr_00 + (long)*(int *)(in_RDI + 4 + (long)local_44 * 8) * 4) =
                   local_44;
              local_68 = *(int *)(in_RDI + 4 + (long)local_44 * 8);
            }
          }
          for (local_44 = 0; local_44 < in_EDX; local_44 = local_44 + 1) {
            iVar2 = *(int *)(in_RSI + (long)local_44 * 4);
            uVar4 = *(undefined8 *)(in_RDI + (long)local_44 * 8);
            local_74 = (int)uVar4;
            iStack_70 = (int)((ulong)uVar4 >> 0x20);
            if ((((local_44 < 1) || (*(int *)(in_RDI + (long)(local_44 + -1) * 8) != local_74 + -1))
                || ((*(int *)(in_RDI + 4 + (long)(local_44 + -1) * 8) != iStack_70 ||
                    (*(int *)(in_RSI + (long)(local_44 + -1) * 4) < iVar2)))) &&
               (((in_EDX + -1 <= local_44 ||
                 (*(int *)(in_RDI + (long)(local_44 + 1) * 8) != local_74 + 1)) ||
                ((*(int *)(in_RDI + 4 + (long)(local_44 + 1) * 8) != iStack_70 ||
                 (*(int *)(in_RSI + (long)(local_44 + 1) * 4) < iVar2)))))) {
              if ((iStack_70 < 1) || (*(int *)((long)__ptr_00 + (long)(iStack_70 + -1) * 4) == -1))
              {
LAB_0072f7f3:
                if (((iStack_70 + 1 < iVar1 + 1) &&
                    (*(int *)((long)__ptr_00 + (long)(iStack_70 + 1) * 4) != -1)) &&
                   (local_64 < in_EDX)) {
                  if (*(int *)(in_RDI + 4 + (long)local_64 * 8) < iStack_70 + 1) {
                    local_64 = *(int *)((long)__ptr_00 + (long)(iStack_70 + 1) * 4);
                  }
                  while( true ) {
                    bVar5 = false;
                    if ((local_64 < in_EDX) &&
                       (bVar5 = false, *(int *)(in_RDI + 4 + (long)local_64 * 8) == iStack_70 + 1))
                    {
                      bVar5 = *(int *)(in_RDI + (long)local_64 * 8) < local_74 + -1;
                    }
                    if (!bVar5) break;
                    local_64 = local_64 + 1;
                  }
                  local_48 = local_64;
                  while( true ) {
                    bVar5 = false;
                    if ((local_48 < in_EDX) &&
                       (bVar5 = false, *(int *)(in_RDI + 4 + (long)local_48 * 8) == iStack_70 + 1))
                    {
                      bVar5 = *(int *)(in_RDI + (long)local_48 * 8) <= local_74 + 1;
                    }
                    if (!bVar5) goto LAB_0072f986;
                    iVar3 = *(int *)(in_RDI + (long)local_48 * 8);
                    if ((((iVar3 == local_74 + -1) || (iVar3 == local_74)) ||
                        (iVar3 == local_74 + 1)) && (iVar2 <= *(int *)(in_RSI + (long)local_48 * 4))
                       ) break;
                    local_48 = local_48 + 1;
                  }
                }
                else {
LAB_0072f986:
                  local_8[local_34] = *(xy *)(in_RDI + (long)local_44 * 8);
                  *(undefined4 *)((long)__ptr + (long)local_34 * 4) =
                       *(undefined4 *)(in_RSI + (long)local_44 * 4);
                  local_34 = local_34 + 1;
                }
              }
              else {
                if (*(int *)(in_RDI + 4 + (long)local_60 * 8) < iStack_70 + -1) {
                  local_60 = *(int *)((long)__ptr_00 + (long)(iStack_70 + -1) * 4);
                }
                while( true ) {
                  bVar5 = false;
                  if (*(int *)(in_RDI + 4 + (long)local_60 * 8) < iStack_70) {
                    bVar5 = *(int *)(in_RDI + (long)local_60 * 8) < local_74 + -1;
                  }
                  if (!bVar5) break;
                  local_60 = local_60 + 1;
                }
                local_48 = local_60;
                while( true ) {
                  bVar5 = false;
                  if (*(int *)(in_RDI + 4 + (long)local_48 * 8) < iStack_70) {
                    bVar5 = *(int *)(in_RDI + (long)local_48 * 8) <= local_74 + 1;
                  }
                  if (!bVar5) goto LAB_0072f7f3;
                  iVar3 = *(int *)(in_RDI + (long)local_48 * 8);
                  if ((((iVar3 == local_74 + -1) || (iVar3 == local_74)) || (iVar3 == local_74 + 1))
                     && (iVar2 <= *(int *)(in_RSI + (long)local_48 * 4))) break;
                  local_48 = local_48 + 1;
                }
              }
            }
          }
          free(__ptr_00);
          *in_RCX = __ptr;
          *in_R8 = local_34;
        }
      }
    }
  }
  return local_8;
}

Assistant:

xy* aom_nonmax_suppression(const xy* corners, const int* scores, int num_corners,
                           int** ret_scores, int* ret_num_nonmax)
{
  int num_nonmax=0;
  int last_row;
  int* row_start;
  int i, j;
  xy* ret_nonmax;
  int* nonmax_scores;
  const int sz = (int)num_corners;

  /*Point above points (roughly) to the pixel above the one of interest, if there
    is a feature there.*/
  int point_above = 0;
  int point_below = 0;

  *ret_scores = 0;
  *ret_num_nonmax = -1;
  if(!(corners && scores) || num_corners < 1)
  {
    *ret_num_nonmax = 0;
    return 0;
  }

  ret_nonmax = (xy*)malloc(num_corners * sizeof(xy));
  if(!ret_nonmax)
  {
    return 0;
  }

  nonmax_scores = (int*)malloc(num_corners * sizeof(*nonmax_scores));
  if (!nonmax_scores)
  {
    free(ret_nonmax);
    return 0;
  }

  /* Find where each row begins
     (the corners are output in raster scan order). A beginning of -1 signifies
     that there are no corners on that row. */
  last_row = corners[num_corners-1].y;
  row_start = (int*)malloc((last_row+1)*sizeof(int));
  if(!row_start)
  {
    free(ret_nonmax);
    free(nonmax_scores);
    return 0;
  }

  for(i=0; i < last_row+1; i++)
    row_start[i] = -1;

  {
    int prev_row = -1;
    for(i=0; i< num_corners; i++)
      if(corners[i].y != prev_row)
      {
        row_start[corners[i].y] = i;
        prev_row = corners[i].y;
      }
  }



  for(i=0; i < sz; i++)
  {
    int score = scores[i];
    xy pos = corners[i];
    assert(pos.y <= last_row);

    /*Check left */
    if(i > 0)
      if(corners[i-1].x == pos.x-1 && corners[i-1].y == pos.y && Compare(scores[i-1], score))
        continue;

    /*Check right*/
    if(i < (sz - 1))
      if(corners[i+1].x == pos.x+1 && corners[i+1].y == pos.y && Compare(scores[i+1], score))
        continue;

    /*Check above (if there is a valid row above)*/
    if(pos.y > 0 && row_start[pos.y - 1] != -1)
    {
      /*Make sure that current point_above is one
        row above.*/
      if(corners[point_above].y < pos.y - 1)
        point_above = row_start[pos.y-1];

      /*Make point_above point to the first of the pixels above the current point,
        if it exists.*/
      for(; corners[point_above].y < pos.y && corners[point_above].x < pos.x - 1; point_above++)
      {}


      for(j=point_above; corners[j].y < pos.y && corners[j].x <= pos.x + 1; j++)
      {
        int x = corners[j].x;
        if( (x == pos.x - 1 || x ==pos.x || x == pos.x+1) && Compare(scores[j], score))
          goto cont;
      }

    }

    /*Check below (if there is anything below)*/
    if (pos.y + 1 < last_row+1 && row_start[pos.y + 1] != -1 && point_below < sz) /*Nothing below*/
    {
      if(corners[point_below].y < pos.y + 1)
        point_below = row_start[pos.y+1];

      /* Make point below point to one of the pixels belowthe current point, if it
         exists.*/
      for(; point_below < sz && corners[point_below].y == pos.y+1 && corners[point_below].x < pos.x - 1; point_below++)
      {}

      for(j=point_below; j < sz && corners[j].y == pos.y+1 && corners[j].x <= pos.x + 1; j++)
      {
        int x = corners[j].x;
        if( (x == pos.x - 1 || x ==pos.x || x == pos.x+1) && Compare(scores[j],score))
          goto cont;
      }
    }

    ret_nonmax[num_nonmax] = corners[i];
    nonmax_scores[num_nonmax] = scores[i];
    num_nonmax++;
cont:
    ;
  }

  free(row_start);
  *ret_scores = nonmax_scores;
  *ret_num_nonmax = num_nonmax;
  return ret_nonmax;
}